

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenEM64T.cpp
# Opt level: O2

void Centaurus::DryParserEM64T<wchar_t>::emit_machine
               (X86Assembler *as,ATNMachine<wchar_t> *machine,
               unordered_map<Centaurus::Identifier,_asmjit::Label,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>_>
               *machine_map,CompositeATN<wchar_t> *catn,Identifier *id,Label *rejectlabel,
               MyConstPool *pool)

{
  uint uVar1;
  Operand_ *o0;
  pointer pAVar2;
  int i;
  int iVar3;
  pointer pAVar4;
  long lVar5;
  long lVar6;
  vector<asmjit::Label,_std::allocator<asmjit::Label>_> statelabels;
  vector<asmjit::Label,_std::allocator<asmjit::Label>_> exitlabels;
  NFABase<Centaurus::DFAState<wchar_t>_> local_90;
  ATNPath local_70;
  ATNPath local_50;
  
  iVar3 = 0;
  statelabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  statelabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  statelabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  while( true ) {
    pAVar4 = (machine->m_nodes).
             super__Vector_base<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pAVar2 = (machine->m_nodes).
             super__Vector_base<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((int)(((long)pAVar2 - (long)pAVar4) / 0x98) <= iVar3) break;
    (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[7])
              (&local_90,as,((long)pAVar2 - (long)pAVar4) % 0x98);
    std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::emplace_back<asmjit::Label>
              (&statelabels,(Label *)&local_90);
    iVar3 = iVar3 + 1;
  }
  lVar5 = 0;
  while( true ) {
    if ((int)(((long)pAVar2 - (long)pAVar4) / 0x98) <= lVar5) break;
    (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[9])
              (as,statelabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>.
                  _M_impl.super__Vector_impl_data._M_start + lVar5,
               ((long)pAVar2 - (long)pAVar4) % 0x98);
    pAVar4 = (machine->m_nodes).
             super__Vector_base<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    switch(pAVar4[lVar5].m_type) {
    case Nonterminal:
      o0 = (Operand_ *)
           std::__detail::
           _Map_base<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_asmjit::Label>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_asmjit::Label>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)machine_map,&pAVar4[lVar5].m_invoke);
      asmjit::CodeEmitter::emit((CodeEmitter *)as,0x3b,o0);
      break;
    case LiteralTerminal:
      MatchRoutineEM64T<wchar_t>::emit(as,pool,rejectlabel,&pAVar4[lVar5].m_literal);
      break;
    case RegularTerminal:
      DFA<wchar_t>::DFA((DFA<wchar_t> *)&local_90,&pAVar4[lVar5].m_nfa,true);
      DFARoutineEM64T<wchar_t>::emit(as,rejectlabel,(DFA<wchar_t> *)&local_90,pool);
      NFABase<Centaurus::DFAState<wchar_t>_>::~NFABase(&local_90);
      break;
    case WhiteSpace:
      SkipRoutineEM64T<wchar_t>::emit(as);
    }
    lVar6 = *(long *)&pAVar4[lVar5].m_transitions.
                      super__Vector_base<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>
                      ._M_impl.super__Vector_impl_data;
    uVar1 = (uint)(((long)pAVar4[lVar5].m_transitions.
                          super__Vector_base<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - lVar6) / 0x18);
    if (uVar1 == 1) {
      asmjit::CodeEmitter::emit
                ((CodeEmitter *)as,0x11e,
                 (Operand_ *)
                 (statelabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>.
                  _M_impl.super__Vector_impl_data._M_start + *(int *)(lVar6 + 0xc)));
    }
    else if (uVar1 == 0) {
      asmjit::CodeEmitter::emit((CodeEmitter *)as,0x276);
    }
    else {
      exitlabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      exitlabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      exitlabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      for (lVar6 = 0; (ulong)(~((int)uVar1 >> 0x1f) & uVar1) * 0x18 - lVar6 != 0;
          lVar6 = lVar6 + 0x18) {
        std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::push_back
                  ((vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)
                   &exitlabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>,
                   statelabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>.
                   _M_impl.super__Vector_impl_data._M_start +
                   *(int *)(*(long *)&pAVar4[lVar5].m_transitions.
                                      super__Vector_base<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>
                                      ._M_impl.super__Vector_impl_data + 0xc + lVar6));
      }
      ATNPath::ATNPath(&local_70,id,(int)lVar5);
      CompositeATN<wchar_t>::convert_atn_path(&local_50,catn,&local_70);
      LookaheadDFA<wchar_t>::LookaheadDFA((LookaheadDFA<wchar_t> *)&local_90,catn,&local_50,true);
      LDFARoutineEM64T<wchar_t>::emit
                (as,rejectlabel,(LookaheadDFA<wchar_t> *)&local_90,
                 (vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)
                 &exitlabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>);
      NFABase<Centaurus::LDFAState<wchar_t>_>::~NFABase
                ((NFABase<Centaurus::LDFAState<wchar_t>_> *)&local_90);
      std::
      vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
      ::~vector(&local_50.
                 super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
               );
      std::
      vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
      ::~vector(&local_70.
                 super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
               );
      std::_Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>::~_Vector_base
                (&exitlabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>);
    }
    lVar5 = lVar5 + 1;
    pAVar4 = (machine->m_nodes).
             super__Vector_base<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pAVar2 = (machine->m_nodes).
             super__Vector_base<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  std::_Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>::~_Vector_base
            (&statelabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>);
  return;
}

Assistant:

void DryParserEM64T<TCHAR>::emit_machine(asmjit::X86Assembler& as, const ATNMachine<TCHAR>& machine, std::unordered_map<Identifier, asmjit::Label>& machine_map, const CompositeATN<TCHAR>& catn, const Identifier& id, asmjit::Label& rejectlabel, MyConstPool& pool)
{
    std::vector<asmjit::Label> statelabels;

    for (int i = 0; i < machine.get_node_num(); i++)
    {
        statelabels.push_back(as.newLabel());
    }

    for (int i = 0; i < machine.get_node_num(); i++)
    {
        as.bind(statelabels[i]);

        const ATNNode<TCHAR>& node = machine.get_node(i);

        switch (node.type())
        {
        case ATNNodeType::Blank:
            break;
        case ATNNodeType::LiteralTerminal:
            MatchRoutineEM64T<TCHAR>::emit(as, pool, rejectlabel, node.get_literal());
            break;
        case ATNNodeType::Nonterminal:
            as.call(machine_map[node.get_invoke()]);
            break;
        case ATNNodeType::RegularTerminal:
            DFARoutineEM64T<TCHAR>::emit(as, rejectlabel, DFA<TCHAR>(node.get_nfa()), pool);
            break;
        case ATNNodeType::WhiteSpace:
            SkipRoutineEM64T<TCHAR>::emit(as);
            break;
        }

        int outbound_num = node.get_transitions().size();
        if (outbound_num == 0)
        {
            as.ret();
        }
        else if (outbound_num == 1)
        {
            as.jmp(statelabels[node.get_transition(0).dest()]);
        }
        else
        {
            std::vector<asmjit::Label> exitlabels;

            for (int j = 0; j < outbound_num; j++)
            {
                exitlabels.push_back(statelabels[node.get_transition(j).dest()]);
            }

            LDFARoutineEM64T<TCHAR>::emit(as, rejectlabel, LookaheadDFA<TCHAR>(catn, catn.convert_atn_path(ATNPath(id, i))), exitlabels);
        }
    }
}